

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

SegmentAnd<capnp::word_*>
capnp::_::WireHelpers::copyPointer
          (SegmentBuilder *dstSegment,CapTableBuilder *dstCapTable,WirePointer *dst,
          SegmentReader *srcSegment,CapTableReader *srcCapTable,WirePointer *src,word *srcTarget,
          int nestingLimit,BuilderArena *orphanArena,bool canonical)

{
  WirePointer *pWVar1;
  StructReader value;
  ListReader value_00;
  ListReader value_01;
  void *pvVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SegmentBuilder *extraout_RAX;
  SegmentBuilder *extraout_RAX_00;
  uint uVar5;
  ulong uVar6;
  SegmentReader *pSVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  word *pwVar11;
  word *extraout_RDX;
  word *extraout_RDX_00;
  WirePointer *pWVar12;
  byte bVar13;
  SegmentReader **ppSVar14;
  ushort uVar15;
  ulong uVar16;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *pDVar17;
  bool bVar18;
  SegmentAnd<capnp::word_*> SVar19;
  SegmentReader *srcSegment_local;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> _kjCondition;
  SegmentReader *newSegment;
  void *local_d0;
  Fault f_2;
  undefined1 uStack_99;
  undefined4 uStack_94;
  undefined1 uStack_69;
  undefined4 uStack_64;
  undefined2 uStack_3a;
  undefined4 uStack_34;
  SegmentBuilder *pSVar4;
  
  uVar5 = (src->offsetAndKind).value;
  srcSegment_local = srcSegment;
  if ((src->field_1).upper32Bits != 0 || uVar5 != 0) {
    pWVar12 = src;
    if ((uVar5 & 3) == 2 && srcSegment != (SegmentReader *)0x0) {
      iVar3 = (*srcSegment->arena->_vptr_Arena[2])();
      srcSegment_local = (SegmentReader *)CONCAT44(extraout_var,iVar3);
      _kjCondition.left = &srcSegment_local;
      _kjCondition.right = (void *)0x0;
      _kjCondition.op.content.ptr = " != ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = srcSegment_local != (SegmentReader *)0x0;
      if (_kjCondition.result) {
        uVar5 = (src->offsetAndKind).value;
        uVar16 = (ulong)(uVar5 >> 3);
        uVar9 = (srcSegment_local->ptr).size_;
        if ((long)uVar9 < (long)uVar16) {
          uVar16 = uVar9;
        }
        uVar6 = 2 - (ulong)((uVar5 & 4) == 0);
        if (uVar16 + uVar6 <= uVar9) {
          pWVar12 = (WirePointer *)((srcSegment_local->ptr).ptr + uVar16);
          uVar9 = srcSegment_local->readLimiter->limit;
          if (uVar6 <= uVar9) {
            srcSegment_local->readLimiter->limit = uVar9 - uVar6;
            if (((src->offsetAndKind).value & 4) != 0) {
              iVar3 = (*srcSegment_local->arena->_vptr_Arena[2])
                                (srcSegment_local->arena,(ulong)(pWVar12->field_1).upper32Bits);
              newSegment = (SegmentReader *)CONCAT44(extraout_var_00,iVar3);
              _kjCondition.left = &newSegment;
              _kjCondition.right = (void *)0x0;
              _kjCondition.op.content.ptr = " != ";
              _kjCondition.op.content.size_ = 5;
              _kjCondition.result = newSegment != (SegmentReader *)0x0;
              if (newSegment == (SegmentReader *)0x0) {
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                          (&f_2,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x25f,FAILED,"newSegment != nullptr",
                           "_kjCondition,\"Message contains double-far pointer to unknown segment.\""
                           ,&_kjCondition,
                           (char (*) [56])"Message contains double-far pointer to unknown segment.")
                ;
LAB_00239f12:
                srcTarget = (word *)0x0;
                kj::_::Debug::Fault::~Fault(&f_2);
              }
              else {
                uVar5 = (pWVar12->offsetAndKind).value & 3;
                _kjCondition.left = (SegmentReader **)CONCAT44(2,uVar5);
                _kjCondition.right = anon_var_dwarf_a914;
                _kjCondition.op.content.ptr = &DAT_00000005;
                _kjCondition.op.content.size_ = (size_t)(uVar5 == 2);
                if (uVar5 != 2) {
                  kj::_::Debug::Fault::
                  Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                            (&f_2,
                             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                             ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                             "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                             (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind>
                              *)&_kjCondition,
                             (char (*) [51])"Second word of double-far pad must be far pointer.");
                  goto LAB_00239f12;
                }
                uVar16 = (ulong)((pWVar12->offsetAndKind).value >> 3);
                uVar9 = (newSegment->ptr).size_;
                if ((long)uVar9 < (long)uVar16) {
                  uVar16 = uVar9;
                }
                srcTarget = (newSegment->ptr).ptr + uVar16;
                srcSegment_local = newSegment;
              }
              pWVar12 = pWVar12 + 1;
              goto LAB_002398d3;
            }
            pWVar1 = pWVar12 + 1;
            uVar5 = (pWVar12->offsetAndKind).value;
            lVar10 = (long)((int)uVar5 >> 2);
            if (srcSegment_local == (SegmentReader *)0x0) {
              srcTarget = (word *)(pWVar1 + lVar10);
              switch(uVar5 & 3) {
              case 1:
                goto switchD_00239a88_caseD_1;
              case 2:
                goto switchD_00239a88_caseD_2;
              case 3:
                goto switchD_00239a88_caseD_3;
              }
            }
            else {
              pwVar11 = (srcSegment_local->ptr).ptr;
              srcTarget = pwVar11 + (srcSegment_local->ptr).size_;
              if ((lVar10 < (long)pwVar11 - (long)pWVar1 >> 3) ||
                 ((long)srcTarget - (long)pWVar1 >> 3 < lVar10)) goto LAB_002398d3;
              srcTarget = (word *)(pWVar1 + lVar10);
              switch(uVar5 & 3) {
              case 1:
                goto switchD_00239a88_caseD_1;
              case 2:
                goto switchD_00239a88_caseD_2;
              case 3:
                goto switchD_00239a88_caseD_3;
              }
            }
            goto switchD_00239a88_caseD_0;
          }
          (*srcSegment_local->arena->_vptr_Arena[3])();
        }
        newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
        pDVar17 = &_kjCondition;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
                  ((Fault *)pDVar17,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
                   "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                   ,(DebugExpression<bool> *)&newSegment,
                   (char (*) [318])
                   "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                  );
        goto LAB_00239daa;
      }
      pDVar17 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
                ((Fault *)pDVar17,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x244,FAILED,"segment != nullptr",
                 "_kjCondition,\"Message contains far pointer to unknown segment.\"",&_kjCondition,
                 (char (*) [49])"Message contains far pointer to unknown segment.");
LAB_002399e0:
      kj::_::Debug::Fault::~Fault((Fault *)pDVar17);
    }
    else {
LAB_002398d3:
      if ((WirePointer *)srcTarget != (WirePointer *)0x0) {
        uVar5 = (pWVar12->offsetAndKind).value;
        switch(uVar5 & 3) {
        case 0:
switchD_00239a88_caseD_0:
          _kjCondition.left = (SegmentReader **)&nestingLimit;
          _kjCondition.right = (void *)((ulong)_kjCondition.right & 0xffffffff00000000);
          _kjCondition.op.content.ptr = " > ";
          _kjCondition.op.content.size_ = 4;
          _kjCondition.result = 0 < nestingLimit;
          if (nestingLimit < 1) {
            iVar3 = 0x7bc;
LAB_00239da0:
            _kjCondition.left = (SegmentReader **)&nestingLimit;
            _kjCondition.op.content.size_ = 4;
            _kjCondition.op.content.ptr = " > ";
            pDVar17 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&,char_const(&)[76]>
                      ((Fault *)&newSegment,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,iVar3,FAILED,"nestingLimit > 0",
                       "_kjCondition,\"Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.\""
                       ,(DebugComparison<int_&,_int> *)&_kjCondition,
                       (char (*) [76])
                       "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions."
                      );
          }
          else {
            if (srcSegment_local == (SegmentReader *)0x0) {
              pSVar7 = (SegmentReader *)0x0;
LAB_00239f5a:
              value.pointerCount = (pWVar12->field_1).structRef.ptrCount.value;
              value.dataSize = (uint)*(ushort *)&pWVar12->field_1 << 6;
              value._38_2_ = uStack_3a;
              value._44_4_ = uStack_34;
              value.nestingLimit = nestingLimit + -1;
              value.capTable = srcCapTable;
              value.segment = pSVar7;
              value.data = srcTarget;
              value.pointers = (WirePointer *)srcTarget + *(ushort *)&pWVar12->field_1;
              SVar19 = setStructPointer(dstSegment,dstCapTable,dst,value,orphanArena,canonical);
LAB_0023a27c:
              pwVar11 = SVar19.value;
              pSVar4 = SVar19.segment;
              goto LAB_00239dde;
            }
            uVar9 = (ulong)(pWVar12->field_1).structRef.dataSize.value +
                    (ulong)(pWVar12->field_1).structRef.ptrCount.value;
            if (((long)srcTarget - (long)(srcSegment_local->ptr).ptr >> 3) + uVar9 <=
                (srcSegment_local->ptr).size_) {
              uVar16 = srcSegment_local->readLimiter->limit;
              if (uVar9 <= uVar16) {
                srcSegment_local->readLimiter->limit = uVar16 - uVar9;
                pSVar7 = srcSegment_local;
                goto LAB_00239f5a;
              }
              (*srcSegment_local->arena->_vptr_Arena[3])();
            }
            newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
            pDVar17 = &_kjCondition;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[322]>
                      ((Fault *)pDVar17,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x7c2,FAILED,"boundsCheck(srcSegment, ptr, src->structRef.wordSize())",
                       "_kjCondition,\"Message contained out-of-bounds struct pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                       ,(DebugExpression<bool> *)&newSegment,
                       (char (*) [322])
                       "Message contained out-of-bounds struct pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                      );
          }
          break;
        case 1:
switchD_00239a88_caseD_1:
          _kjCondition.left = (SegmentReader **)&nestingLimit;
          _kjCondition.right = (void *)((ulong)_kjCondition.right & 0xffffffff00000000);
          _kjCondition.op.content.ptr = " > ";
          _kjCondition.op.content.size_ = 4;
          _kjCondition.result = 0 < nestingLimit;
          if (nestingLimit < 1) {
            iVar3 = 0x7d1;
            goto LAB_00239da0;
          }
          bVar13 = *(byte *)&pWVar12->field_1 & 7;
          if (bVar13 != 7) {
            iVar3 = *(int *)(BITS_PER_ELEMENT_TABLE + ((ulong)*(byte *)&pWVar12->field_1 & 7) * 4);
            uVar5 = (uint)(bVar13 == 6) * 0x40 + iVar3;
            uVar8 = (pWVar12->field_1).upper32Bits >> 3;
            uVar9 = (ulong)uVar8;
            if (srcSegment_local != (SegmentReader *)0x0) {
              uVar16 = uVar5 * uVar9 + 0x3f >> 6 & 0xffffffff;
              if (((long)srcTarget - (long)(srcSegment_local->ptr).ptr >> 3) + uVar16 <=
                  (srcSegment_local->ptr).size_) {
                uVar6 = srcSegment_local->readLimiter->limit;
                if (uVar16 <= uVar6) {
                  srcSegment_local->readLimiter->limit = uVar6 - uVar16;
                  goto LAB_0023a0e4;
                }
                (*srcSegment_local->arena->_vptr_Arena[3])();
              }
              newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
              pDVar17 = &_kjCondition;
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[319]>
                        ((Fault *)pDVar17,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x807,FAILED,"boundsCheck(srcSegment, ptr, wordCount)",
                         "_kjCondition,\"Message contains out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                         ,(DebugExpression<bool> *)&newSegment,
                         (char (*) [319])
                         "Message contains out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                        );
              goto LAB_002399e0;
            }
LAB_0023a0e4:
            pSVar7 = srcSegment_local;
            if (bVar13 == 0) {
              if (srcSegment_local == (SegmentReader *)0x0) {
                pSVar7 = (SegmentReader *)0x0;
              }
              else {
                uVar16 = srcSegment_local->readLimiter->limit;
                if (uVar16 < uVar9) {
                  copyPointer();
                  goto LAB_00239dbb;
                }
                srcSegment_local->readLimiter->limit = uVar16 - uVar9;
              }
              uVar15 = 0;
              bVar13 = 0;
            }
            else {
              uVar15 = (ushort)(bVar13 == 6);
            }
            value_00.step = uVar5;
            value_00.elementCount = uVar8;
            value_00.structPointerCount = uVar15;
            value_00.structDataSize = iVar3;
            value_00.elementSize = bVar13;
            value_00._39_1_ = uStack_99;
            value_00._44_4_ = uStack_94;
            value_00.nestingLimit = nestingLimit + -1;
            value_00.capTable = srcCapTable;
            value_00.segment = pSVar7;
            value_00.ptr = (byte *)srcTarget;
            SVar19 = setListPointer(dstSegment,dstCapTable,dst,value_00,orphanArena,canonical);
            goto LAB_0023a27c;
          }
          f_2.exception._0_4_ = (pWVar12->field_1).upper32Bits >> 3;
          if (srcSegment_local == (SegmentReader *)0x0) {
LAB_0023a057:
            uVar5 = (((WirePointer *)srcTarget)->offsetAndKind).value & 3;
            _kjCondition.left = (SegmentReader **)(ulong)uVar5;
            _kjCondition.right = anon_var_dwarf_a914;
            _kjCondition.op.content.ptr = &DAT_00000005;
            _kjCondition.op.content.size_ = (size_t)(uVar5 == 0);
            if (uVar5 != 0) {
              pDVar17 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[61]>
                        ((Fault *)pDVar17,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x7e2,FAILED,"tag->kind() == WirePointer::STRUCT",
                         "_kjCondition,\"INLINE_COMPOSITE lists of non-STRUCT type are not supported.\""
                         ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind>
                           *)&_kjCondition,
                         (char (*) [61])
                         "INLINE_COMPOSITE lists of non-STRUCT type are not supported.");
              goto LAB_0023a1e8;
            }
            uVar5 = (((WirePointer *)srcTarget)->offsetAndKind).value >> 2;
            uVar9 = (ulong)(uVar5 & 0x1fffffff);
            uVar8 = (uint)(((WirePointer *)srcTarget)->field_1).structRef.ptrCount.value +
                    (uint)(((WirePointer *)srcTarget)->field_1).structRef.dataSize.value;
            _kjCondition.left = (SegmentReader **)(uVar8 * uVar9);
            _kjCondition.right = &f_2;
            _kjCondition.op.content.ptr = " <= ";
            ppSVar14 = (SegmentReader **)(ulong)(uint)f_2.exception;
            _kjCondition.op.content.size_ = 5;
            bVar18 = (long)_kjCondition.left - (long)ppSVar14 == 0;
            _kjCondition.result = _kjCondition.left < ppSVar14 || bVar18;
            if (_kjCondition.left >= ppSVar14 && !bVar18) {
              pDVar17 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int&>&,char_const(&)[57]>
                        ((Fault *)pDVar17,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x7ea,FAILED,
                         "wordsPerElement * upgradeBound<uint64_t>(elementCount) <= wordCount",
                         "_kjCondition,\"INLINE_COMPOSITE list\'s elements overrun its word count.\""
                         ,(DebugComparison<unsigned_long,_unsigned_int_&> *)&_kjCondition,
                         (char (*) [57])"INLINE_COMPOSITE list\'s elements overrun its word count.")
              ;
              goto LAB_0023a1e8;
            }
            pSVar7 = srcSegment_local;
            if (uVar8 != 0) {
LAB_0023a287:
              uVar9 = CONCAT44(uVar8 * 0x40,uVar5) & 0xffffffff1fffffff;
              value_01.structPointerCount =
                   (((WirePointer *)srcTarget)->field_1).structRef.ptrCount.value;
              value_01.structDataSize =
                   (uint)(((WirePointer *)srcTarget)->field_1).structRef.dataSize.value << 6;
              value_01.elementSize = 7;
              value_01._39_1_ = uStack_69;
              value_01._44_4_ = uStack_64;
              value_01.nestingLimit = nestingLimit + -1;
              value_01.capTable = srcCapTable;
              value_01.segment = pSVar7;
              value_01.ptr = (byte *)((WirePointer *)srcTarget + 1);
              value_01.elementCount = (int)uVar9;
              value_01.step = (int)(uVar9 >> 0x20);
              SVar19 = setListPointer(dstSegment,dstCapTable,dst,value_01,orphanArena,canonical);
              pwVar11 = SVar19.value;
              pSVar4 = SVar19.segment;
              iVar3 = 1;
              goto LAB_0023a1f9;
            }
            if (srcSegment_local == (SegmentReader *)0x0) {
              pSVar7 = (SegmentReader *)0x0;
              goto LAB_0023a287;
            }
            uVar16 = srcSegment_local->readLimiter->limit;
            if (uVar9 <= uVar16) {
              srcSegment_local->readLimiter->limit = uVar16 - uVar9;
              goto LAB_0023a287;
            }
            copyPointer();
            pSVar4 = extraout_RAX_00;
            pwVar11 = extraout_RDX_00;
          }
          else {
            if (((long)srcTarget - (long)(srcSegment_local->ptr).ptr >> 3) +
                (ulong)(uint)f_2.exception + 1 <= (srcSegment_local->ptr).size_) {
              uVar9 = (ulong)(uint)f_2.exception + 1;
              uVar16 = srcSegment_local->readLimiter->limit;
              if (uVar9 <= uVar16) {
                srcSegment_local->readLimiter->limit = uVar16 - uVar9;
                goto LAB_0023a057;
              }
              (*srcSegment_local->arena->_vptr_Arena[3])();
            }
            newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
            pDVar17 = &_kjCondition;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[319]>
                      ((Fault *)pDVar17,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x7db,FAILED,
                       "boundsCheck(srcSegment, ptr, wordCount + POINTER_SIZE_IN_WORDS)",
                       "_kjCondition,\"Message contains out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                       ,(DebugExpression<bool> *)&newSegment,
                       (char (*) [319])
                       "Message contains out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                      );
LAB_0023a1e8:
            kj::_::Debug::Fault::~Fault((Fault *)pDVar17);
            pSVar4 = extraout_RAX;
            pwVar11 = extraout_RDX;
          }
          iVar3 = 2;
LAB_0023a1f9:
          if (iVar3 != 2) goto LAB_00239dde;
          goto LAB_00239dbb;
        case 2:
switchD_00239a88_caseD_2:
          pDVar17 = &_kjCondition;
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                    ((Fault *)pDVar17,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x81c,FAILED,(char *)0x0,"\"Unexpected FAR pointer.\"",
                     (char (*) [24])"Unexpected FAR pointer.");
          break;
        case 3:
switchD_00239a88_caseD_3:
          newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,uVar5 == 3);
          if (uVar5 == 3) {
            if (canonical != false) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[52]>
                        ((Fault *)&_kjCondition,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x826,FAILED,(char *)0x0,
                         "\"Cannot create a canonical message with a capability\"",
                         (char (*) [52])"Cannot create a canonical message with a capability");
              kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
            }
            (**srcCapTable->_vptr_CapTableReader)
                      (&newSegment,srcCapTable,(ulong)(pWVar12->field_1).upper32Bits);
            _kjCondition.left = (SegmentReader **)newSegment;
            _kjCondition.right = local_d0;
            if (local_d0 == (void *)0x0) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[46]>
                        ((Fault *)&newSegment,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x831,FAILED,(char *)0x0,
                         "\"Message contained invalid capability pointer.\"",
                         (char (*) [46])"Message contained invalid capability pointer.");
              kj::_::Debug::Fault::~Fault((Fault *)&newSegment);
              iVar3 = 2;
            }
            else {
              setCapabilityPointer
                        (dstSegment,dstCapTable,dst,
                         (Own<capnp::ClientHook,_std::nullptr_t> *)&_kjCondition);
              pvVar2 = _kjCondition.right;
              iVar3 = 1;
              if (_kjCondition.right != (void *)0x0) {
                _kjCondition.right = (void *)0x0;
                (*(code *)(*_kjCondition.left)->arena)
                          (_kjCondition.left,(long)pvVar2 + *(long *)(*pvVar2 + -0x10));
              }
            }
            pwVar11 = (word *)0x1;
            pSVar4 = dstSegment;
            goto LAB_0023a1f9;
          }
          pDVar17 = &_kjCondition;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[22]>
                    ((Fault *)pDVar17,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x821,FAILED,"src->isCapability()","_kjCondition,\"Unknown pointer type.\"",
                     (DebugExpression<bool> *)&newSegment,(char (*) [22])"Unknown pointer type.");
        }
LAB_00239daa:
        kj::_::Debug::Fault::~Fault((Fault *)pDVar17);
      }
    }
  }
LAB_00239dbb:
  if ((dst->field_1).upper32Bits != 0 || (dst->offsetAndKind).value != 0) {
    zeroObject(dstSegment,dstCapTable,dst);
    dst->offsetAndKind = 0;
    dst->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  }
  pwVar11 = (word *)0x0;
  pSVar4 = dstSegment;
LAB_00239dde:
  SVar19.value = pwVar11;
  SVar19.segment = pSVar4;
  return SVar19;
}

Assistant:

static SegmentAnd<word*> copyPointer(
      SegmentBuilder* dstSegment, CapTableBuilder* dstCapTable, WirePointer* dst,
      SegmentReader* srcSegment, CapTableReader* srcCapTable, const WirePointer* src,
      const word* srcTarget, int nestingLimit,
      BuilderArena* orphanArena = nullptr, bool canonical = false) {
    // Deep-copy the object pointed to by src into dst.  It turns out we can't reuse
    // readStructPointer(), etc. because they do type checking whereas here we want to accept any
    // valid pointer.

    if (src->isNull()) {
    useDefault:
      if (!dst->isNull()) {
        zeroObject(dstSegment, dstCapTable, dst);
        zeroMemory(dst);
      }
      return { dstSegment, nullptr };
    }

    const word* ptr;
    KJ_IF_SOME(p, WireHelpers::followFars(src, srcTarget, srcSegment)) {
      ptr = &p;
    } else {
      goto useDefault;
    }

    switch (src->kind()) {
      case WirePointer::STRUCT:
        KJ_REQUIRE(nestingLimit > 0,
              "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.") {
          goto useDefault;
        }

        KJ_REQUIRE(boundsCheck(srcSegment, ptr, src->structRef.wordSize()),
                   "Message contained out-of-bounds struct pointer. "
                   OUT_OF_BOUNDS_ERROR_DETAIL) {
          goto useDefault;
        }
        return setStructPointer(dstSegment, dstCapTable, dst,
            StructReader(srcSegment, srcCapTable, ptr,
                         reinterpret_cast<const WirePointer*>(ptr + src->structRef.dataSize.get()),
                         src->structRef.dataSize.get() * BITS_PER_WORD,
                         src->structRef.ptrCount.get(),
                         nestingLimit - 1),
            orphanArena, canonical);

      case WirePointer::LIST: {
        ElementSize elementSize = src->listRef.elementSize();

        KJ_REQUIRE(nestingLimit > 0,
              "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.") {
          goto useDefault;
        }

        if (elementSize == ElementSize::INLINE_COMPOSITE) {
          auto wordCount = src->listRef.inlineCompositeWordCount();
          const WirePointer* tag = reinterpret_cast<const WirePointer*>(ptr);

          KJ_REQUIRE(boundsCheck(srcSegment, ptr, wordCount + POINTER_SIZE_IN_WORDS),
                     "Message contains out-of-bounds list pointer. "
                     OUT_OF_BOUNDS_ERROR_DETAIL) {
            goto useDefault;
          }

          ptr += POINTER_SIZE_IN_WORDS;

          KJ_REQUIRE(tag->kind() == WirePointer::STRUCT,
                     "INLINE_COMPOSITE lists of non-STRUCT type are not supported.") {
            goto useDefault;
          }

          auto elementCount = tag->inlineCompositeListElementCount();
          auto wordsPerElement = tag->structRef.wordSize() / ELEMENTS;

          KJ_REQUIRE(wordsPerElement * upgradeBound<uint64_t>(elementCount) <= wordCount,
                     "INLINE_COMPOSITE list's elements overrun its word count.") {
            goto useDefault;
          }

          if (wordsPerElement * (ONE * ELEMENTS) == ZERO * WORDS) {
            // Watch out for lists of zero-sized structs, which can claim to be arbitrarily large
            // without having sent actual data.
            KJ_REQUIRE(amplifiedRead(srcSegment, elementCount * (ONE * WORDS / ELEMENTS)),
                       "Message contains amplified list pointer.") {
              goto useDefault;
            }
          }

          return setListPointer(dstSegment, dstCapTable, dst,
              ListReader(srcSegment, srcCapTable, ptr,
                         elementCount, wordsPerElement * BITS_PER_WORD,
                         tag->structRef.dataSize.get() * BITS_PER_WORD,
                         tag->structRef.ptrCount.get(), ElementSize::INLINE_COMPOSITE,
                         nestingLimit - 1),
              orphanArena, canonical);
        } else {
          auto dataSize = dataBitsPerElement(elementSize) * ELEMENTS;
          auto pointerCount = pointersPerElement(elementSize) * ELEMENTS;
          auto step = (dataSize + pointerCount * BITS_PER_POINTER) / ELEMENTS;
          auto elementCount = src->listRef.elementCount();
          auto wordCount = roundBitsUpToWords(upgradeBound<uint64_t>(elementCount) * step);

          KJ_REQUIRE(boundsCheck(srcSegment, ptr, wordCount),
                     "Message contains out-of-bounds list pointer. "
                     OUT_OF_BOUNDS_ERROR_DETAIL) {
            goto useDefault;
          }

          if (elementSize == ElementSize::VOID) {
            // Watch out for lists of void, which can claim to be arbitrarily large without having
            // sent actual data.
            KJ_REQUIRE(amplifiedRead(srcSegment, elementCount * (ONE * WORDS / ELEMENTS)),
                       "Message contains amplified list pointer.") {
              goto useDefault;
            }
          }

          return setListPointer(dstSegment, dstCapTable, dst,
              ListReader(srcSegment, srcCapTable, ptr, elementCount, step, dataSize, pointerCount,
                         elementSize, nestingLimit - 1),
              orphanArena, canonical);
        }
      }

      case WirePointer::FAR:
        KJ_FAIL_REQUIRE("Unexpected FAR pointer.") {
          goto useDefault;
        }

      case WirePointer::OTHER: {
        KJ_REQUIRE(src->isCapability(), "Unknown pointer type.") {
          goto useDefault;
        }

        if (canonical) {
          KJ_FAIL_REQUIRE("Cannot create a canonical message with a capability") {
            break;
          }
        }
#if !CAPNP_LITE
        KJ_IF_SOME(cap, srcCapTable->extractCap(src->capRef.index.get())) {
          setCapabilityPointer(dstSegment, dstCapTable, dst, kj::mv(cap));
          // Return dummy non-null pointer so OrphanBuilder doesn't end up null.
          return { dstSegment, reinterpret_cast<word*>(1) };
        } else {
#endif  // !CAPNP_LITE
          KJ_FAIL_REQUIRE("Message contained invalid capability pointer.") {
            goto useDefault;
          }
#if !CAPNP_LITE
        }
#endif  // !CAPNP_LITE
      }
    }

    KJ_UNREACHABLE;
  }